

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_validate.cpp
# Opt level: O3

void __thiscall ktx::CommandValidate::executeValidate(CommandValidate *this)

{
  bool warningsAsErrors;
  bool GLTFBasisU;
  OutputFormat OVar1;
  char *pcVar2;
  size_type sVar3;
  undefined1 auVar4 [16];
  int iVar5;
  undefined8 *puVar6;
  size_type __rlen;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_00;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_01;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_02;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_03;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_04;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_05;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_06;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_07;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_08;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_09;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_10;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_11;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_12;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_13;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_14;
  format_args args_15;
  format_args args_16;
  format_args args_17;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  bool first;
  char *nl;
  __string_type validationMessages;
  char *space;
  PrintIndent pi;
  ostringstream messagesOS;
  InputStream inputStream;
  char local_611;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_610;
  string local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5c8;
  size_type sStack_5c0;
  ostringstream *local_5b8;
  undefined4 local_5b0;
  uint local_5ac;
  _Any_data local_5a8;
  code *local_598;
  code *pcStack_590;
  _Any_data local_580;
  code *local_570;
  code *local_568;
  ostringstream local_560 [112];
  ios_base local_4f0 [264];
  undefined1 local_3e8 [952];
  
  InputStream::InputStream
            ((InputStream *)local_3e8,&(this->options).super_OptionsSingleIn.inputFilepath,
             &(this->super_Command).super_Reporter);
  OVar1 = (this->options).super_OptionsFormat.format;
  if (OVar1 - json < 2) {
    bVar9 = OVar1 == json;
    local_5d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x1fecc1;
    if (!bVar9) {
      local_5d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x217ddc;
    }
    local_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x1fcdf2;
    if (!bVar9) {
      local_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x217ddc;
    }
    std::__cxx11::ostringstream::ostringstream(local_560);
    uVar7 = (uint)bVar9 * 4;
    local_5b0 = 0;
    local_611 = '\x01';
    pcVar2 = (this->options).super_OptionsSingleIn.inputFilepath._M_dataplus._M_p;
    sVar3 = (this->options).super_OptionsSingleIn.inputFilepath._M_string_length;
    local_5b8 = local_560;
    local_5ac = uVar7;
    if ((sVar3 == 1) && (*pcVar2 == '-')) {
      local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
      local_608.field_2._M_allocated_capacity._0_6_ = 0x6e69647473;
      local_608._M_string_length = 5;
    }
    else {
      local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,pcVar2,pcVar2 + sVar3);
    }
    warningsAsErrors = (this->options).super_OptionsValidate.warningsAsErrors;
    GLTFBasisU = (this->options).super_OptionsValidate.GLTFBasisU;
    local_598 = (code *)0x0;
    pcStack_590 = (code *)0x0;
    local_5a8._M_unused._M_object = (void *)0x0;
    local_5a8._8_8_ = 0;
    local_5a8._M_unused._M_object = operator_new(0x20);
    *(char **)local_5a8._M_unused._0_8_ = &local_611;
    *(ostringstream ***)((long)local_5a8._M_unused._0_8_ + 8) = &local_5b8;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      ***)((long)local_5a8._M_unused._0_8_ + 0x10) = &local_610;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      ***)((long)local_5a8._M_unused._0_8_ + 0x18) = &local_5d0;
    pcStack_590 = std::
                  _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_validate.cpp:163:17)>
                  ::_M_invoke;
    local_598 = std::
                _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_validate.cpp:163:17)>
                ::_M_manager;
    iVar5 = validateIOStream((istream *)local_3e8._32_8_,&local_608,warningsAsErrors,GLTFBasisU,
                             (function<void_(const_ktx::ValidationReport_&)> *)&local_5a8);
    if (local_598 != (code *)0x0) {
      (*local_598)(&local_5a8,&local_5a8,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p != &local_608.field_2) {
      operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
    }
    local_608._M_dataplus._M_p = "";
    local_608.field_2._M_allocated_capacity = 0;
    format_str.size_ = 5;
    format_str.data_ = "{:{}}";
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
    args.desc_ = 0x1c;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str,args);
    local_608._M_dataplus._M_p = (pointer)local_610;
    format_str_00.size_ = 4;
    format_str_00.data_ = "{{{}";
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
    args_00.desc_ = 0xc;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_00,args_00);
    uVar8 = (ulong)uVar7;
    local_608._M_dataplus._M_p = "";
    format_str_01.size_ = 5;
    format_str_01.data_ = "{:{}}";
    args_01.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
    args_01.desc_ = 0x1c;
    local_608.field_2._M_allocated_capacity = uVar8;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_01,args_01);
    local_608._M_dataplus._M_p = (pointer)local_5d0;
    local_608.field_2._M_allocated_capacity = (size_type)local_610;
    format_str_02.size_ = 0x40;
    format_str_02.data_ = "\"$schema\":{}\"https://schema.khronos.org/ktx/validate_v0.json\",{}";
    args_02.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
    args_02.desc_ = 0xcc;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_02,args_02);
    local_608._M_dataplus._M_p = "";
    format_str_03.size_ = 5;
    format_str_03.data_ = "{:{}}";
    args_03.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
    args_03.desc_ = 0x1c;
    local_608.field_2._M_allocated_capacity = uVar8;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_03,args_03);
    local_608.field_2._M_allocated_capacity = (size_type)(iVar5 == 0);
    local_608._M_dataplus._M_p = (pointer)local_5d0;
    local_5e8 = local_610;
    format_str_04.size_ = 0xf;
    format_str_04.data_ = "\"valid\":{}{},{}";
    args_04.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
    args_04.desc_ = 0xc7c;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_04,args_04);
    if (local_611 == '\0') {
      local_608._M_dataplus._M_p = "";
      format_str_07.size_ = 5;
      format_str_07.data_ = "{:{}}";
      args_07.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
      args_07.desc_ = 0x1c;
      local_608.field_2._M_allocated_capacity = uVar8;
      ::fmt::v10::vprint<char>
                ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_07,args_07);
      local_608._M_dataplus._M_p = (pointer)local_5d0;
      local_608.field_2._M_allocated_capacity = (size_type)local_610;
      format_str_08.size_ = 0x10;
      format_str_08.data_ = "\"messages\":{}[{}";
      args_08.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
      args_08.desc_ = 0xcc;
      ::fmt::v10::vprint<char>
                ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_08,args_08);
      std::__cxx11::stringbuf::str();
      local_5c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._M_dataplus._M_p;
      sStack_5c0 = local_608._M_string_length;
      args_15.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_5c8;
      args_15.desc_ = 0xd;
      fmt.size_ = 2;
      fmt.data_ = "{}";
      ::fmt::v10::vprint(fmt,args_15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != &local_608.field_2) {
        operator_delete(local_608._M_dataplus._M_p,
                        (ulong)(local_608.field_2._M_allocated_capacity + 1));
      }
      local_608.field_2._M_allocated_capacity = (size_type)((uint)bVar9 * 8);
      local_608._M_dataplus._M_p = "";
      format_str_09.size_ = 5;
      format_str_09.data_ = "{:{}}";
      args_09.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
      args_09.desc_ = 0x1c;
      ::fmt::v10::vprint<char>
                ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_09,args_09);
      local_608._M_dataplus._M_p = (pointer)local_610;
      format_str_10.size_ = 4;
      format_str_10.data_ = "}}{}";
      args_10.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
      args_10.desc_ = 0xc;
      ::fmt::v10::vprint<char>
                ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_10,args_10);
      local_608._M_dataplus._M_p = "";
      format_str_11.size_ = 5;
      format_str_11.data_ = "{:{}}";
      args_11.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
      args_11.desc_ = 0x1c;
      local_608.field_2._M_allocated_capacity = uVar8;
      ::fmt::v10::vprint<char>
                ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_11,args_11);
      local_608._M_dataplus._M_p = (pointer)local_610;
      format_str_12.size_ = 3;
      format_str_12.data_ = "]{}";
      args_12.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
      args_12.desc_ = 0xc;
      ::fmt::v10::vprint<char>
                ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_12,args_12);
    }
    else {
      local_608._M_dataplus._M_p = "";
      format_str_05.size_ = 5;
      format_str_05.data_ = "{:{}}";
      args_05.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
      args_05.desc_ = 0x1c;
      local_608.field_2._M_allocated_capacity = uVar8;
      ::fmt::v10::vprint<char>
                ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_05,args_05);
      local_608._M_dataplus._M_p = (pointer)local_5d0;
      local_608.field_2._M_allocated_capacity = (size_type)local_610;
      format_str_06.size_ = 0x11;
      format_str_06.data_ = "\"messages\":{}[]{}";
      args_06.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
      args_06.desc_ = 0xcc;
      ::fmt::v10::vprint<char>
                ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_06,args_06);
    }
    local_608._M_dataplus._M_p = "";
    local_608.field_2._M_allocated_capacity = 0;
    format_str_13.size_ = 5;
    format_str_13.data_ = "{:{}}";
    args_13.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
    args_13.desc_ = 0x1c;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_13,args_13);
    local_608._M_dataplus._M_p = (pointer)local_610;
    format_str_14.size_ = 4;
    format_str_14.data_ = "}}{}";
    args_14.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_608;
    args_14.desc_ = 0xc;
    ::fmt::v10::vprint<char>
              ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,format_str_14,args_14);
    if (iVar5 != 0) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar6 = &PTR__exception_0025b838;
      *(undefined4 *)(puVar6 + 1) = 3;
      __cxa_throw(puVar6,&FatalError::typeinfo,std::exception::~exception);
    }
  }
  else {
    if (OVar1 != text) goto LAB_001a3e37;
    std::__cxx11::ostringstream::ostringstream(local_560);
    pcVar2 = (this->options).super_OptionsSingleIn.inputFilepath._M_dataplus._M_p;
    sVar3 = (this->options).super_OptionsSingleIn.inputFilepath._M_string_length;
    if ((sVar3 == 1) && (*pcVar2 == '-')) {
      local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
      local_608.field_2._M_allocated_capacity._0_6_ = 0x6e69647473;
      local_608._M_string_length = 5;
    }
    else {
      local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,pcVar2,pcVar2 + sVar3);
    }
    local_580._8_8_ = 0;
    local_568 = std::
                _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_validate.cpp:131:17)>
                ::_M_invoke;
    local_570 = std::
                _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_validate.cpp:131:17)>
                ::_M_manager;
    local_580._M_unused._0_8_ = (undefined8)local_560;
    iVar5 = validateIOStream((istream *)local_3e8._32_8_,&local_608,
                             (this->options).super_OptionsValidate.warningsAsErrors,
                             (this->options).super_OptionsValidate.GLTFBasisU,
                             (function<void_(const_ktx::ValidationReport_&)> *)&local_580);
    if (local_570 != (code *)0x0) {
      (*local_570)(&local_580,&local_580,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p != &local_608.field_2) {
      operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    if (local_608._M_string_length != 0) {
      local_5c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x21edb5;
      if (iVar5 == 0) {
        local_5c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1fbf07;
      }
      args_16.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_5c8;
      args_16.desc_ = 0xc;
      fmt_00.size_ = 0xe;
      fmt_00.data_ = "Validation {}\n";
      ::fmt::v10::vprint(fmt_00,args_16);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = &local_5c8;
      fmt_01.size_ = 1;
      fmt_01.data_ = "\n";
      ::fmt::v10::vprint(fmt_01,(format_args)(auVar4 << 0x40));
      local_5c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._M_dataplus._M_p;
      sStack_5c0 = local_608._M_string_length;
      args_17.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_5c8;
      args_17.desc_ = 0xd;
      fmt_02.size_ = 2;
      fmt_02.data_ = "{}";
      ::fmt::v10::vprint(fmt_02,args_17);
    }
    if (iVar5 != 0) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar6 = &PTR__exception_0025b838;
      *(undefined4 *)(puVar6 + 1) = 3;
      __cxa_throw(puVar6,&FatalError::typeinfo,std::exception::~exception);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p != &local_608.field_2) {
      operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_560);
  std::ios_base::~ios_base(local_4f0);
LAB_001a3e37:
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_3e8 + 0x230));
  std::ios_base::~ios_base((ios_base *)(local_3e8 + 0x2b0));
  std::ifstream::~ifstream(local_3e8 + 0x28);
  if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
    operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
  }
  return;
}

Assistant:

void CommandValidate::executeValidate() {
    InputStream inputStream(options.inputFilepath, *this);

    switch (options.format) {
    case OutputFormat::text: {
        std::ostringstream messagesOS;
        const auto validationResult = validateIOStream(
                inputStream,
                fmtInFile(options.inputFilepath),
                options.warningsAsErrors,
                options.GLTFBasisU,
                [&](const ValidationReport& issue) {
            fmt::print(messagesOS, "{}-{:04}: {}\n", toString(issue.type), issue.id, issue.message);
            fmt::print(messagesOS, "    {}\n", issue.details);
        });

        const auto validationMessages = std::move(messagesOS).str();
        if (!validationMessages.empty()) {
            fmt::print("Validation {}\n", validationResult == 0 ? "successful" : "failed");
            fmt::print("\n");
            fmt::print("{}", validationMessages);
        }

        if (validationResult != 0)
            throw FatalError(rc::INVALID_FILE);
        break;
    }
    case OutputFormat::json: [[fallthrough]];
    case OutputFormat::json_mini: {
        const auto base_indent = options.format == OutputFormat::json ? +0 : 0;
        const auto indent_width = options.format == OutputFormat::json ? 4 : 0;
        const auto space = options.format == OutputFormat::json ? " " : "";
        const auto nl = options.format == OutputFormat::json ? "\n" : "";

        std::ostringstream messagesOS;
        PrintIndent pi{messagesOS, base_indent, indent_width};

        bool first = true;
        const auto validationResult = validateIOStream(
                inputStream,
                fmtInFile(options.inputFilepath),
                options.warningsAsErrors,
                options.GLTFBasisU,
                [&](const ValidationReport& issue) {
            if (!std::exchange(first, false)) {
                pi(2, "}},{}", nl);
            }
            pi(2, "{{{}", nl);
            pi(3, "\"id\":{}{},{}", space, issue.id, nl);
            pi(3, "\"type\":{}\"{}\",{}", space, toString(issue.type), nl);
            pi(3, "\"message\":{}\"{}\",{}", space, escape_json_copy(issue.message), nl);
            pi(3, "\"details\":{}\"{}\"{}", space, escape_json_copy(issue.details), nl);
        });

        PrintIndent out{std::cout, base_indent, indent_width};
        out(0, "{{{}", nl);
        out(1, "\"$schema\":{}\"https://schema.khronos.org/ktx/validate_v0.json\",{}", space, nl);
        out(1, "\"valid\":{}{},{}", space, validationResult == 0, nl);
        if (!first) {
            out(1, "\"messages\":{}[{}", space, nl);
            fmt::print("{}", std::move(messagesOS).str());
            out(2, "}}{}", nl);
            out(1, "]{}", nl);
        } else {
            out(1, "\"messages\":{}[]{}", space, nl);
        }
        out(0, "}}{}", nl);

        if (validationResult != 0)
            throw FatalError(rc::INVALID_FILE);
        break;
    }
    }
}